

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O0

string * __thiscall
vkt::geometry::(anonymous_namespace)::GeometryExpanderRenderTest::shaderGeometry_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool pointSize)

{
  ostream *poVar1;
  size_t sVar2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  string local_1e8;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream src;
  bool pointSize_local;
  GeometryExpanderRenderTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"#version 310 es\n");
  std::operator<<(poVar1,"#extension GL_EXT_geometry_shader : require\n");
  if (pointSize) {
    std::operator<<((ostream *)local_198,"#extension GL_EXT_geometry_point_size : require\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,"layout(");
  inputTypeToGLString_abi_cxx11_
            (&local_1c8,(geometry *)((long)this + 0x70),
             (VkPrimitiveTopology *)CONCAT71(extraout_var,extraout_DL));
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1,") in;\n");
  poVar1 = std::operator<<(poVar1,"layout(");
  outputTypeToGLString_abi_cxx11_
            (&local_1e8,(geometry *)((long)this + 0x74),
             (VkPrimitiveTopology *)CONCAT71(extraout_var_00,extraout_DL_00));
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1,", max_vertices = ");
  sVar2 = calcOutputVertices((VkPrimitiveTopology *)((long)this + 0x70));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1,") out;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 v_geom_FragColor[];\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out highp vec4 v_frag_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp vec4 offset0 = vec4(-0.07, -0.01, 0.0, 0.0);\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp vec4 offset1 = vec4( 0.03, -0.03, 0.0, 0.0);\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp vec4 offset2 = vec4(-0.01,  0.08, 0.0, 0.0);\n");
  poVar1 = std::operator<<(poVar1,
                           "\thighp vec4 yoffset = float(gl_PrimitiveIDIn) * vec4(0.02, 0.1, 0.0, 0.0);\n"
                          );
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tfor (highp int ndx = 0; ndx < gl_in.length(); ndx++)\n");
  std::operator<<(poVar1,"\t{\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (pointSize) {
    std::operator<<((ostream *)local_198,"\t\tgl_PointSize = 1.0;\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,
                           "\t\tgl_Position = gl_in[ndx].gl_Position + offset0 + yoffset;\n");
  poVar1 = std::operator<<(poVar1,"\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n");
  poVar1 = std::operator<<(poVar1,"\t\tEmitVertex();\n");
  std::operator<<(poVar1,"\n");
  if (pointSize) {
    std::operator<<((ostream *)local_198,"\t\tgl_PointSize = 1.0;\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,
                           "\t\tgl_Position = gl_in[ndx].gl_Position + offset1 + yoffset;\n");
  poVar1 = std::operator<<(poVar1,"\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n");
  poVar1 = std::operator<<(poVar1,"\t\tEmitVertex();\n");
  std::operator<<(poVar1,"\n");
  if (pointSize) {
    std::operator<<((ostream *)local_198,"\t\tgl_PointSize = 1.0;\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,
                           "\t\tgl_Position = gl_in[ndx].gl_Position + offset2 + yoffset;\n");
  poVar1 = std::operator<<(poVar1,"\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n");
  poVar1 = std::operator<<(poVar1,"\t\tEmitVertex();\n");
  poVar1 = std::operator<<(poVar1,"\t\tEndPrimitive();\n");
  poVar1 = std::operator<<(poVar1,"\t}\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string GeometryExpanderRenderTest::shaderGeometry (bool pointSize) const
{
	std::ostringstream src;
	src	<< "#version 310 es\n"
		<< "#extension GL_EXT_geometry_shader : require\n";
	if (pointSize)
		src	<<"#extension GL_EXT_geometry_point_size : require\n";
	src	<< "layout(" << inputTypeToGLString(m_primitiveType) << ") in;\n"
		<< "layout(" << outputTypeToGLString(m_outputType) << ", max_vertices = " << calcOutputVertices(m_primitiveType) << ") out;\n"
		<< "layout(location = 0) in highp vec4 v_geom_FragColor[];\n"
		<< "layout(location = 0) out highp vec4 v_frag_FragColor;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	const highp vec4 offset0 = vec4(-0.07, -0.01, 0.0, 0.0);\n"
		<< "	const highp vec4 offset1 = vec4( 0.03, -0.03, 0.0, 0.0);\n"
		<< "	const highp vec4 offset2 = vec4(-0.01,  0.08, 0.0, 0.0);\n"
		<< "	highp vec4 yoffset = float(gl_PrimitiveIDIn) * vec4(0.02, 0.1, 0.0, 0.0);\n"
		<< "\n"
		<< "	for (highp int ndx = 0; ndx < gl_in.length(); ndx++)\n"
		<< "	{\n";
		if (pointSize)
			src	<< "		gl_PointSize = 1.0;\n";
	src	<< "		gl_Position = gl_in[ndx].gl_Position + offset0 + yoffset;\n"
		<< "		v_frag_FragColor = v_geom_FragColor[ndx];\n"
		<< "		EmitVertex();\n"
		<< "\n";
		if (pointSize)
			src	<< "		gl_PointSize = 1.0;\n";
	src	<< "		gl_Position = gl_in[ndx].gl_Position + offset1 + yoffset;\n"
		<< "		v_frag_FragColor = v_geom_FragColor[ndx];\n"
		<< "		EmitVertex();\n"
		<< "\n";
		if (pointSize)
			src	<< "		gl_PointSize = 1.0;\n";
	src	<< "		gl_Position = gl_in[ndx].gl_Position + offset2 + yoffset;\n"
		<< "		v_frag_FragColor = v_geom_FragColor[ndx];\n"
		<< "		EmitVertex();\n"
		<< "		EndPrimitive();\n"
		<< "	}\n"
		<< "}\n";
	return src.str();
}